

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

void htmlParserFinishElementParsing(htmlParserCtxtPtr ctxt)

{
  _xmlNode *p_Var1;
  xmlParserInputPtr pxVar2;
  xmlParserNodeInfoPtr info;
  
  p_Var1 = ctxt->node;
  if ((p_Var1 != (_xmlNode *)0x0) && (ctxt->record_info != 0)) {
    pxVar2 = ctxt->input;
    info = ctxt->nodeInfo;
    info->end_pos = (unsigned_long)(pxVar2->cur + (pxVar2->consumed - (long)pxVar2->base));
    info->end_line = (long)pxVar2->line;
    info->node = p_Var1;
    xmlParserAddNodeInfo(ctxt,info);
    htmlNodeInfoPop(ctxt);
  }
  if (*ctxt->input->cur != '\0') {
    return;
  }
  htmlAutoCloseOnEnd(ctxt);
  return;
}

Assistant:

static void
htmlParserFinishElementParsing(htmlParserCtxtPtr ctxt) {
    /*
     * Capture end position and add node
     */
    if ( ctxt->node != NULL && ctxt->record_info ) {
       ctxt->nodeInfo->end_pos = ctxt->input->consumed +
                                (CUR_PTR - ctxt->input->base);
       ctxt->nodeInfo->end_line = ctxt->input->line;
       ctxt->nodeInfo->node = ctxt->node;
       xmlParserAddNodeInfo(ctxt, ctxt->nodeInfo);
       htmlNodeInfoPop(ctxt);
    }
    if (CUR == 0) {
       htmlAutoCloseOnEnd(ctxt);
    }
}